

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderBarrier3::TessellationShaderBarrier3
          (TessellationShaderBarrier3 *this,Context *context,ExtParameters *extParams)

{
  TestCaseBase::TestCaseBase
            ((TestCaseBase *)this,context,extParams,"barrier_guarded_read_write_calls",
             "Verifies it is safe to write to the same per-patch output from multiple TC invocations, as long as each write happens in a separate phase."
            );
  (this->super_TessellationShaderBarrierTestCase).m_tcs_id = 0;
  (this->super_TessellationShaderBarrierTestCase).m_tes_id = 0;
  (this->super_TessellationShaderBarrierTestCase).m_vao_id = 0;
  (this->super_TessellationShaderBarrierTestCase).m_vs_id = 0;
  (this->super_TessellationShaderBarrierTestCase).m_bo_id = 0;
  (this->super_TessellationShaderBarrierTestCase).m_fs_id = 0;
  (this->super_TessellationShaderBarrierTestCase).m_po_id = 0;
  (this->super_TessellationShaderBarrierTestCase).m_tcs_id = 0;
  (this->super_TessellationShaderBarrierTestCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__TestCaseBase_02111e70;
  this->m_n_patches_per_invocation = 2;
  this->m_n_result_vertices = 0x280;
  *(undefined8 *)&(this->super_TessellationShaderBarrierTestCase).field_0x2cc = 0xa00000500;
  this->m_n_invocations = 0x10;
  this->m_n_patch_vertices = 8;
  return;
}

Assistant:

TessellationShaderBarrier3::TessellationShaderBarrier3(Context& context, const ExtParameters& extParams)
	: TessellationShaderBarrierTestCase(context, extParams, "barrier_guarded_read_write_calls",
										"Verifies it is safe to write to the same per-patch output "
										"from multiple TC invocations, as long as each write happens "
										"in a separate phase.")
	, m_n_instances(10)				/* as per test spec */
	, m_n_invocations(16)			/* as per test spec */
	, m_n_patch_vertices(8)			/* as per test spec */
	, m_n_patches_per_invocation(2) /* as per test spec */
	, m_n_result_vertices(2 /* result points per isoline */ * m_n_patches_per_invocation * m_n_invocations *
						  m_n_instances)
{
	m_n_input_vertices = (m_n_result_vertices / 2 /* result points per isoline */) * 4 /* vertices per patch */;
}